

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallSubDictionaries(void)

{
  JL_STATUS JVar1;
  int iVar2;
  bool bVar3;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  OuterStruct theStruct;
  JlMarshallElement marshalOuterStruct [2];
  JlMarshallElement marshalInnerStruct2 [3];
  JlMarshallElement marshalInnerStruct1 [2];
  size_t errorAtPos;
  WJTL_STATUS TestReturn;
  
  errorAtPos._4_4_ = WJTL_STATUS_SUCCESS;
  marshalInnerStruct1[1].ChildStructDescriptionCount = 0;
  marshalInnerStruct1[1]._92_4_ = 0;
  memcpy(&marshalInnerStruct2[2].ChildStructDescriptionCount,&DAT_0014f3b0,0xc0);
  memset(&marshalOuterStruct[1].ChildStructDescriptionCount,0,0x60);
  marshalOuterStruct[1].ChildStructDescriptionCount = 1;
  marshalInnerStruct2[0]._0_8_ = anon_var_dwarf_88bf;
  marshalInnerStruct2[0].IsArray = false;
  marshalInnerStruct2[0]._17_7_ = 0;
  marshalInnerStruct2[0].ChildStructDescriptionCount = 2;
  marshalInnerStruct2[1]._0_8_ = anon_var_dwarf_5b42;
  marshalInnerStruct2[1].Name._0_1_ = 0;
  marshalInnerStruct2[1].IsArray = true;
  marshalInnerStruct2[1]._17_7_ = 0;
  marshalInnerStruct2[1].FieldOffset = 4;
  marshalInnerStruct2[1].FieldSize = 0;
  marshalInnerStruct2[1].CountFieldOffset = 0;
  marshalInnerStruct2[1].CountFieldSize = 0;
  marshalInnerStruct2[1].ArrayFieldSize = 0;
  marshalInnerStruct2[1].ArrayItemSize._0_4_ = 10;
  marshalInnerStruct2[1].ArrayItemSize._4_1_ = 0;
  marshalInnerStruct2[1].ArrayItemSize._5_1_ = 0;
  marshalInnerStruct2[1].NumberType = JL_NUM_TYPE_NONE;
  marshalInnerStruct2[1].IsHex = false;
  marshalInnerStruct2[1].IsBase64 = false;
  marshalInnerStruct2[1]._78_2_ = 0;
  marshalInnerStruct2[1].ChildStructDescription._0_4_ = 0;
  marshalInnerStruct2[1].ChildStructDescriptionCount = 5;
  marshalInnerStruct2[2]._0_8_ = anon_var_dwarf_88d7;
  marshalInnerStruct2[2].Name._0_1_ = 0;
  marshalInnerStruct2[2].IsArray = true;
  marshalInnerStruct2[2]._17_7_ = 0;
  marshalInnerStruct2[2].FieldOffset = 0x10;
  marshalInnerStruct2[2].FieldSize = 0;
  marshalInnerStruct2[2].CountFieldOffset = 0;
  marshalInnerStruct2[2].CountFieldSize = 0;
  marshalInnerStruct2[2].ArrayFieldSize = 0;
  marshalInnerStruct2[2].ArrayItemSize._0_4_ = 0;
  marshalInnerStruct2[2].ArrayItemSize._4_1_ = 0;
  marshalInnerStruct2[2].ArrayItemSize._5_1_ = 0;
  marshalInnerStruct2[2]._72_8_ = &marshalInnerStruct2[2].ChildStructDescriptionCount;
  marshalInnerStruct2[2].ChildStructDescription._0_4_ = 2;
  theStruct.Inner2.Inner.Number1 = 5;
  marshalOuterStruct[0]._0_8_ = anon_var_dwarf_88e3;
  marshalOuterStruct[0].Name._0_1_ = 0;
  marshalOuterStruct[0].IsArray = false;
  marshalOuterStruct[0]._17_7_ = 0;
  marshalOuterStruct[0].FieldOffset = 0x10;
  marshalOuterStruct[0].FieldSize = 0;
  marshalOuterStruct[0].CountFieldOffset = 0;
  marshalOuterStruct[0].CountFieldSize = 0;
  marshalOuterStruct[0].ArrayFieldSize = 0;
  marshalOuterStruct[0].ArrayItemSize._0_4_ = 0;
  marshalOuterStruct[0].ArrayItemSize._4_1_ = 0;
  marshalOuterStruct[0].ArrayItemSize._5_1_ = 0;
  marshalOuterStruct[0]._72_8_ = &marshalInnerStruct2[2].ChildStructDescriptionCount;
  marshalOuterStruct[0].ChildStructDescription._0_4_ = 2;
  marshalOuterStruct[0].ChildStructDescriptionCount = 5;
  marshalOuterStruct[1]._0_8_ = anon_var_dwarf_88ef;
  marshalOuterStruct[1].Name._0_1_ = 0;
  marshalOuterStruct[1].IsArray = true;
  marshalOuterStruct[1]._17_7_ = 0;
  marshalOuterStruct[1].FieldOffset = 0x20;
  marshalOuterStruct[1].FieldSize = 0;
  marshalOuterStruct[1].CountFieldOffset = 0;
  marshalOuterStruct[1].CountFieldSize = 0;
  marshalOuterStruct[1].ArrayFieldSize = 0;
  marshalOuterStruct[1].ArrayItemSize._0_4_ = 0;
  marshalOuterStruct[1].ArrayItemSize._4_1_ = 0;
  marshalOuterStruct[1].ArrayItemSize._5_1_ = 0;
  marshalOuterStruct[1]._72_8_ = &marshalOuterStruct[1].ChildStructDescriptionCount;
  marshalOuterStruct[1].ChildStructDescription._0_4_ = 3;
  memset(&_result_7,0,0x30);
  JVar1 = JlJsonToStruct("{ \"inner1\": { \"str1\":\"String1\", \"num1\":100 }, \"inner2\": { \"str2\":\"String2\", \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }"
                         ,(JlMarshallElement *)&theStruct.Inner2.Inner.Number1,2,&_result_7,
                         (size_t *)&marshalInnerStruct1[1].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{ \\\"inner1\\\": { \\\"str1\\\":\\\"String1\\\", \\\"num1\\\":100 }, \\\"inner2\\\": { \\\"str2\\\":\\\"String2\\\", \\\"num2\\\":200, \\\"inner\\\":{\\\"str1\\\":\\\"String111\\\",\\\"num1\\\":111} } } }\", marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41c);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalInnerStruct1[1]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41d);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(__result_7,"String1");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.Inner1.String1, \"String1\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41e);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert((int)theStruct.Inner1.String1 == 100,"100 == theStruct.Inner1.Number1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41f);
  if ((int)theStruct.Inner1.String1 != 100) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp((char *)theStruct.Inner1._8_8_,"String2");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.Inner2.String2, \"String2\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x420);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert((int)theStruct.Inner2.String2 == 200,"200 == theStruct.Inner2.Number2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x421);
  if ((int)theStruct.Inner2.String2 != 200) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp((char *)theStruct.Inner2._8_8_,"String111");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.Inner2.Inner.String1, \"String111\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x422);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert((int)theStruct.Inner2.Inner.String1 == 0x6f,
                   "111 == theStruct.Inner2.Inner.Number1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x423);
  if ((int)theStruct.Inner2.Inner.String1 != 0x6f) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlUnmarshallFreeStructAllocs
                    ((JlMarshallElement *)&theStruct.Inner2.Inner.Number1,2,&_result_7);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x425);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": { \"str2\":true, \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }"
                         ,(JlMarshallElement *)&theStruct.Inner2.Inner.Number1,2,&_result_7,
                         (size_t *)&marshalInnerStruct1[1].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_WRONG_TYPE,
                   "(JlJsonToStruct( \"{ \\\"inner1\\\": { \\\"str1\\\": \\\"String1\\\", \\\"num1\\\":100 }, \\\"inner2\\\": { \\\"str2\\\":true, \\\"num2\\\":200, \\\"inner\\\":{\\\"str1\\\":\\\"String111\\\",\\\"num1\\\":111} } } }\", marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_WRONG_TYPE)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x42a);
  if (JVar1 != JL_STATUS_WRONG_TYPE) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalInnerStruct1[1]._88_8_ == 0x42;
  WjTestLib_Assert(bVar3,"66 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x42b);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": 100 } }"
                         ,(JlMarshallElement *)&theStruct.Inner2.Inner.Number1,2,&_result_7,
                         (size_t *)&marshalInnerStruct1[1].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_WRONG_TYPE,
                   "(JlJsonToStruct( \"{ \\\"inner1\\\": { \\\"str1\\\": \\\"String1\\\", \\\"num1\\\":100 }, \\\"inner2\\\": 100 } }\", marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_WRONG_TYPE)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x430);
  if (JVar1 != JL_STATUS_WRONG_TYPE) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalInnerStruct1[1]._88_8_ == 0x39;
  WjTestLib_Assert(bVar3,"57 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x431);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  return errorAtPos._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallSubDictionaries
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        char*       String1;
        uint32_t    Number1;
    } InnerStruct1;

    typedef struct
    {
        char*           String2;
        uint32_t        Number2;
        InnerStruct1    Inner;
    } InnerStruct2;

    typedef struct
    {
        InnerStruct1    Inner1;
        InnerStruct2    Inner2;
    } OuterStruct;

    JlMarshallElement marshalInnerStruct1[] = {
        JlMarshallString( InnerStruct1, String1, "str1" ),
        JlMarshallUnsigned( InnerStruct1, Number1, "num1" ),
    };

    JlMarshallElement marshalInnerStruct2[] = {
        JlMarshallString( InnerStruct2, String2, "str2" ),
        JlMarshallUnsigned( InnerStruct2, Number2, "num2" ),
        JlMarshallStruct( InnerStruct2, Inner, "inner", marshalInnerStruct1, NumElements(marshalInnerStruct1) ),
    };
    JlMarshallElement marshalOuterStruct[] = {
        JlMarshallStruct( OuterStruct, Inner1, "inner1", marshalInnerStruct1, NumElements(marshalInnerStruct1) ),
        JlMarshallStruct( OuterStruct, Inner2, "inner2", marshalInnerStruct2, NumElements(marshalInnerStruct2) ),
    };

    OuterStruct theStruct = {{0}};

    // Verify working
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{ \"inner1\": { \"str1\":\"String1\", \"num1\":100 }, \"inner2\": { \"str2\":\"String2\", \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }",
         marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( strcmp( theStruct.Inner1.String1, "String1" ) == 0 );
    JL_ASSERT( 100 == theStruct.Inner1.Number1 );
    JL_ASSERT( strcmp( theStruct.Inner2.String2, "String2" ) == 0 );
    JL_ASSERT( 200 == theStruct.Inner2.Number2 );
    JL_ASSERT( strcmp( theStruct.Inner2.Inner.String1, "String111" ) == 0 );
    JL_ASSERT( 111 == theStruct.Inner2.Inner.Number1 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct ) );

    // Verify wrong type in a sub dictionary
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": { \"str2\":true, \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }",
         marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct, &errorAtPos ), JL_STATUS_WRONG_TYPE );
    JL_ASSERT( 66 == errorAtPos );

    // Verify wrong type in base
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": 100 } }",
         marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct, &errorAtPos ), JL_STATUS_WRONG_TYPE );
    JL_ASSERT( 57 == errorAtPos );

    return TestReturn;
}